

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::generateCppModuleRaiiUsings_abi_cxx11_
          (string *__return_storage_ptr__,VulkanHppGenerator *this)

{
  pointer pFVar1;
  pointer pEVar2;
  pointer pEVar3;
  pointer pFVar4;
  anon_class_16_2_ccbe4ae6 generateUsingsAndProtection;
  string raiiUsingTemplate;
  string local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  VulkanHppGenerator *local_68;
  anon_class_16_2_ccbe4ae6 local_60;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"    using VULKAN_HPP_RAII_NAMESPACE::${className};\n","");
  local_70 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "    //======================\n    //=== RAII HARDCODED ===\n    //======================\n\n    using VULKAN_HPP_RAII_NAMESPACE::Context;\n    namespace detail\n    {\n      using VULKAN_HPP_RAII_NAMESPACE::detail::ContextDispatcher;\n      using VULKAN_HPP_RAII_NAMESPACE::detail::InstanceDispatcher;\n      using VULKAN_HPP_RAII_NAMESPACE::detail::DeviceDispatcher;\n    }\n\n    //====================\n    //=== RAII HANDLEs ===\n    //====================\n"
             ,"");
  pFVar4 = (this->m_features).
           super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (this->m_features).
           super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_68 = this;
  local_60.raiiUsingTemplate = &local_50;
  local_60.this = this;
  if (pFVar4 != pFVar1) {
    do {
      generateCppModuleRaiiUsings::anon_class_16_2_ccbe4ae6::operator()
                (&local_90,&local_60,
                 (vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                  *)(pFVar4->requireData).
                    super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                 &((pFVar4->requireData).
                   super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->api);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_90._M_dataplus._M_p,local_90._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      pFVar4 = pFVar4 + 1;
    } while (pFVar4 != pFVar1);
  }
  pEVar3 = (local_68->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (local_68->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar3 != pEVar2) {
    do {
      generateCppModuleRaiiUsings::anon_class_16_2_ccbe4ae6::operator()
                (&local_90,&local_60,
                 (vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                  *)(pEVar3->requireData).
                    super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                 &((pEVar3->requireData).
                   super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->api);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_90._M_dataplus._M_p,local_90._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      pEVar3 = pEVar3 + 1;
    } while (pEVar3 != pEVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCppModuleRaiiUsings() const
{
  auto const raiiUsingTemplate = std::string{ R"(    using VULKAN_HPP_RAII_NAMESPACE::${className};
)" };
  auto       usings            = std::string{ R"(    //======================
    //=== RAII HARDCODED ===
    //======================

    using VULKAN_HPP_RAII_NAMESPACE::Context;
    namespace detail
    {
      using VULKAN_HPP_RAII_NAMESPACE::detail::ContextDispatcher;
      using VULKAN_HPP_RAII_NAMESPACE::detail::InstanceDispatcher;
      using VULKAN_HPP_RAII_NAMESPACE::detail::DeviceDispatcher;
    }

    //====================
    //=== RAII HANDLEs ===
    //====================
)" };

  auto const generateUsingsAndProtection = [&raiiUsingTemplate, this]( std::vector<RequireData> const & requireData, std::string const & title )
  {
    auto usings = std::string{};
    for ( auto const & require : requireData )
    {
      for ( auto const & type : require.types )
      {
        if ( auto const & handleIt = m_handles.find( type.name ); handleIt != m_handles.end() )
        {
          usings += replaceWithMap( raiiUsingTemplate, { { "className", stripPrefix( handleIt->first, "Vk" ) } } );

          // if there is an array constructor, generate the plural type also
          if ( hasArrayConstructor( handleIt->second ) )
          {
            usings += replaceWithMap( raiiUsingTemplate, { { "className", stripPrefix( type.name, "Vk" ) + "s" } } );
          }
        }
      }
    }
    return addTitleAndProtection( title, usings );
  };

  // now, insert features and extensions with protection, and strip Vk prefix
  for ( auto const & feature : m_features )
  {
    usings += generateUsingsAndProtection( feature.requireData, feature.name );
  }

  for ( auto const & extension : m_extensions )
  {
    usings += generateUsingsAndProtection( extension.requireData, extension.name );
  }

  return usings;
}